

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  int iVar1;
  Float local_60 [2];
  Float local_58;
  RGB local_50;
  SampledSpectrum local_40;
  RGBReflectanceSpectrum local_2c;
  
  iVar1 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,local_60);
  if (iVar1 == 1) {
    SampledSpectrum::SampledSpectrum(&local_40,local_60[0]);
  }
  else {
    local_50.b = local_58;
    RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_2c,RGBColorSpace::sRGB,&local_50);
    local_40 = RGBReflectanceSpectrum::Sample(&local_2c,&lambda);
  }
  return (array<float,_4>)(array<float,_4>)local_40;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB,
                                  RGB(result[0], result[1], result[2]))
        .Sample(lambda);
#endif
}